

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_encoder.cc
# Opt level: O1

void __thiscall draco::RAnsBitEncoder::EncodeBit(RAnsBitEncoder *this,bool bit)

{
  pointer puVar1;
  iterator __position;
  uint32_t uVar2;
  undefined7 in_register_00000031;
  
  puVar1 = (this->bit_counts_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000031,bit) == 0) {
    *puVar1 = *puVar1 + 1;
  }
  else {
    puVar1[1] = puVar1[1] + 1;
    this->local_bits_ = this->local_bits_ | 1 << ((byte)this->num_local_bits_ & 0x1f);
  }
  uVar2 = this->num_local_bits_ + 1;
  this->num_local_bits_ = uVar2;
  if (uVar2 == 0x20) {
    __position._M_current =
         (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->bits_,__position,
                 &this->local_bits_);
    }
    else {
      *__position._M_current = this->local_bits_;
      (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->local_bits_ = 0;
    this->num_local_bits_ = 0;
  }
  return;
}

Assistant:

void RAnsBitEncoder::EncodeBit(bool bit) {
  if (bit) {
    bit_counts_[1]++;
    local_bits_ |= 1 << num_local_bits_;
  } else {
    bit_counts_[0]++;
  }
  num_local_bits_++;

  if (num_local_bits_ == 32) {
    bits_.push_back(local_bits_);
    num_local_bits_ = 0;
    local_bits_ = 0;
  }
}